

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_set_up_topology(Executor *this,Worker *w,Topology *tpg)

{
  Taskflow *pTVar1;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  first;
  Node *o;
  pointer pBVar2;
  int iVar3;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  last;
  size_t n;
  ulong uVar4;
  pthread_mutex_t *__mutex;
  long lVar5;
  
  pTVar1 = tpg->_taskflow;
  last = _set_up_graph<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                   (this,(pTVar1->_graph).
                         super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                    (pTVar1->_graph).
                    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,tpg,(Node *)0x0);
  (tpg->_join_counter).super___atomic_base<unsigned_long>._M_i =
       (long)last._M_current -
       (long)(pTVar1->_graph).
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  first._M_current =
       (pTVar1->_graph).
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       .
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (w != (Worker *)0x0) {
    _schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
              (this,w,first,last);
    return;
  }
  if ((long)last._M_current - (long)first._M_current != 0) {
    n = (long)last._M_current - (long)first._M_current >> 3;
    lVar5 = 0;
    do {
      o = first._M_current[lVar5]._M_t.
          super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
          super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
          super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      pBVar2 = (this->_buffers)._buckets.
               super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (ulong)o %
              (ulong)(((long)(this->_buffers)._buckets.
                             super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 7) *
                     -0x5555555555555555);
      __mutex = (pthread_mutex_t *)(pBVar2 + uVar4);
      iVar3 = pthread_mutex_lock(__mutex);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      UnboundedTaskQueue<tf::Node_*>::push
                (&(this->_buffers)._buckets.
                  super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4].queue,o);
      pthread_mutex_unlock(__mutex);
      lVar5 = lVar5 + 1;
    } while (n + (n == 0) != lVar5);
    NonblockingNotifierV2::notify_n(&this->_notifier,n);
    return;
  }
  return;
}

Assistant:

inline void Executor::_set_up_topology(Worker* w, Topology* tpg) {

  // ---- under taskflow lock ----
  auto& g = tpg->_taskflow._graph;
  
  auto send = _set_up_graph(g.begin(), g.end(), tpg, nullptr);
  tpg->_join_counter.store(send - g.begin(), std::memory_order_relaxed);

  w ? _schedule(*w, g.begin(), send) : _schedule(g.begin(), send);
}